

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  Counts *pCVar1;
  size_t *psVar2;
  IStreamingReporter *pIVar3;
  pointer pcVar4;
  ulong uVar5;
  size_t sVar6;
  Totals *_totals;
  int iVar7;
  SectionTracker *pSVar8;
  undefined4 extraout_var;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  string local_1f8;
  string local_1d8;
  TestCase **local_1b8;
  Totals *local_1b0;
  Totals *local_1a8;
  TrackerContext *local_1a0;
  Totals local_198;
  undefined1 local_160 [40];
  _Alloc_hider _Stack_138;
  
  local_198.testCases.failedButOk = (this->m_totals).testCases.failedButOk;
  local_198.error = (this->m_totals).error;
  local_198._4_4_ = *(undefined4 *)&(this->m_totals).field_0x4;
  local_198.assertions.passed._0_4_ = (undefined4)(this->m_totals).assertions.passed;
  local_198.assertions.passed._4_4_ = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4)
  ;
  local_198.assertions.failed._0_4_ = (undefined4)(this->m_totals).assertions.failed;
  local_198.assertions.failed._4_4_ = *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4)
  ;
  local_198.assertions.failedButOk._0_4_ = (undefined4)(this->m_totals).assertions.failedButOk;
  local_198.assertions.failedButOk._4_4_ =
       *(undefined4 *)((long)&(this->m_totals).assertions.failedButOk + 4);
  local_198.testCases.passed._0_4_ = (undefined4)(this->m_totals).testCases.passed;
  local_198.testCases.passed._4_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  local_198.testCases.failed._0_4_ = (undefined4)(this->m_totals).testCases.failed;
  local_198.testCases.failed._4_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar3->_vptr_IStreamingReporter[7])(pIVar3,testCase);
  this->m_activeTestCase = testCase;
  local_1a0 = &this->m_trackerContext;
  local_1a8 = __return_storage_ptr__;
  pSVar8 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(local_1a0);
  iVar7 = (*(pSVar8->super_TrackerBase).super_ITracker._vptr_ITracker[0xe])(pSVar8);
  if ((char)iVar7 == '\0') {
    __assert_fail("rootTracker.isSectionTracker()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/catch/include/catch/catch.hpp"
                  ,0x31d2,"Totals Catch::RunContext::runTest(const TestCase &)");
  }
  iVar7 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x13])();
  TestCaseTracking::SectionTracker::addInitialFilters
            (pSVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(extraout_var,iVar7));
  local_1b0 = &this->m_totals;
  local_1b8 = &this->m_activeTestCase;
  do {
    (this->m_trackerContext).m_currentTracker =
         (this->m_trackerContext).m_rootTracker.
         super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->m_trackerContext).m_runState = Executing;
    pcVar4 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
    local_160._0_8_ = local_160 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_160,pcVar4,
               pcVar4 + (testCase->super_TestCaseInfo).name._M_string_length);
    local_160._32_8_ = (testCase->super_TestCaseInfo).lineInfo.file;
    _Stack_138._M_p = (pointer)(testCase->super_TestCaseInfo).lineInfo.line;
    pSVar8 = TestCaseTracking::SectionTracker::acquire(local_1a0,(NameAndLocation *)local_160);
    this->m_testCaseTracker = (ITracker *)pSVar8;
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    runCurrentTest(this,&local_1d8,&local_1f8);
    iVar7 = (*this->m_testCaseTracker->_vptr_ITracker[3])();
    if ((char)iVar7 != '\0') break;
    uVar5 = (this->m_totals).assertions.failed;
    iVar7 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[9])();
  } while (uVar5 < (ulong)(long)iVar7);
  _totals = local_1a8;
  Totals::delta(local_1a8,local_1b0,&local_198);
  sVar6 = (_totals->testCases).passed;
  if ((sVar6 != 0 & (byte)(char)(testCase->super_TestCaseInfo).properties >> 2) == 1) {
    psVar2 = &(_totals->assertions).failed;
    *psVar2 = *psVar2 + 1;
    (_totals->testCases).passed = sVar6 - 1;
    psVar2 = &(_totals->testCases).failed;
    *psVar2 = *psVar2 + 1;
  }
  pCVar1 = &(this->m_totals).testCases;
  pCVar1->passed = pCVar1->passed + (_totals->testCases).passed;
  psVar2 = &(this->m_totals).testCases.failed;
  *psVar2 = *psVar2 + (_totals->testCases).failed;
  psVar2 = &(this->m_totals).testCases.failedButOk;
  *psVar2 = *psVar2 + (_totals->testCases).failedButOk;
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  uVar5 = (this->m_totals).assertions.failed;
  iVar7 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[9])();
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_160,&testCase->super_TestCaseInfo,_totals,&local_1d8,&local_1f8,
             (ulong)(long)iVar7 <= uVar5);
  (*pIVar3->_vptr_IStreamingReporter[0xc])(pIVar3,local_160);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_160);
  *local_1b8 = (TestCase *)0x0;
  local_1b8[1] = (TestCase *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  return _totals;
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  redirectedCout,
                                  redirectedCerr,
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }